

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  TestResult *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  TestPartResult *pTVar3;
  ostream *poVar4;
  int line;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int i;
  _Alloc_hider _Var5;
  char *pcVar6;
  internal *this_00;
  string summary;
  string location;
  int local_a4;
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string kTestsuite;
  
  std::__cxx11::string::string((string *)&kTestsuite,"testcase",(allocator *)&location);
  if (test_info->is_in_another_shard_ != false) goto LAB_0011205d;
  std::operator<<(stream,"    <testcase");
  std::__cxx11::string::string((string *)&location,"name",(allocator *)&detail);
  std::__cxx11::string::string
            ((string *)&summary,(test_info->name_)._M_dataplus._M_p,(allocator *)&local_78);
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  pbVar1 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string((string *)&location,"value_param",(allocator *)&detail);
    pbVar1 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var5._M_p = (char *)0x0;
    }
    else {
      _Var5._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&summary,_Var5._M_p,(allocator *)&local_78);
    OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
  }
  pbVar1 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string((string *)&location,"type_param",(allocator *)&detail);
    pbVar1 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var5._M_p = (char *)0x0;
    }
    else {
      _Var5._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&summary,_Var5._M_p,(allocator *)&local_78);
    OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    std::__cxx11::string::string((string *)&location,"file",(allocator *)&detail);
    std::__cxx11::string::string
              ((string *)&summary,(test_info->location_).file._M_dataplus._M_p,
               (allocator *)&local_78);
    OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string((string *)&location,"line",(allocator *)&local_78);
    detail._M_dataplus._M_p._0_4_ = (test_info->location_).line;
    StreamableToString<int>(&summary,(int *)&detail);
    OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
    std::operator<<(stream," />\n");
    goto LAB_0011205d;
  }
  std::__cxx11::string::string((string *)&location,"status",(allocator *)&detail);
  pcVar6 = "notrun";
  if (test_info->should_run_ != false) {
    pcVar6 = "run";
  }
  std::__cxx11::string::string((string *)&summary,pcVar6,(allocator *)&local_78);
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string((string *)&location,"result",(allocator *)&detail);
  this = &test_info->result_;
  if (test_info->should_run_ == true) {
    bVar2 = TestResult::Skipped(this);
    pcVar6 = "completed";
    if (bVar2) {
      pcVar6 = "skipped";
    }
  }
  else {
    pcVar6 = "suppressed";
  }
  std::__cxx11::string::string((string *)&summary,pcVar6,(allocator *)&local_78);
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string((string *)&location,"time",(allocator *)&detail);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&summary,(internal *)(test_info->result_).elapsed_time_,ms)
  ;
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string((string *)&location,"timestamp",(allocator *)&detail);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_
            (&summary,(internal *)(test_info->result_).start_timestamp_,ms_00);
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string((string *)&location,"classname",(allocator *)&detail);
  std::__cxx11::string::string((string *)&summary,test_suite_name,(allocator *)&local_78);
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  local_a4 = 0;
  for (i = 0; line = 0x70,
      i < (int)(((long)(test_info->result_).test_part_results_.
                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(test_info->result_).test_part_results_.
                      super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70); i = i + 1) {
    pTVar3 = TestResult::GetTestPartResult(this,i);
    if (pTVar3->type_ - kNonFatalFailure < 2) {
      if (local_a4 == 0) {
        std::operator<<(stream,">\n");
      }
      this_00 = (internal *)(pTVar3->file_name_)._M_string_length;
      if (this_00 != (internal *)0x0) {
        this_00 = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,this_00,(char *)(ulong)(uint)pTVar3->line_number_,line);
      std::operator+(&detail,&location,"\n");
      std::operator+(&summary,&detail,(pTVar3->summary_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&detail);
      poVar4 = std::operator<<(stream,"      <failure message=\"");
      EscapeXmlAttribute(&detail,&summary);
      poVar4 = std::operator<<(poVar4,(string *)&detail);
      std::operator<<(poVar4,"\" type=\"\">");
      std::__cxx11::string::~string((string *)&detail);
      std::operator+(&local_78,&location,"\n");
      std::operator+(&detail,&local_78,(pTVar3->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_78);
      RemoveInvalidXmlCharacters(&local_78,&detail);
      OutputXmlCDataSection(stream,local_78._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_78);
      std::operator<<(stream,"</failure>\n");
      local_a4 = local_a4 + 1;
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&summary);
      std::__cxx11::string::~string((string *)&location);
    }
  }
  if (local_a4 == 0) {
    if ((int)((ulong)((long)(test_info->result_).test_properties_.
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(test_info->result_).test_properties_.
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) != 0) {
      std::operator<<(stream,">\n");
      goto LAB_00112043;
    }
    pcVar6 = " />\n";
  }
  else {
LAB_00112043:
    OutputXmlTestProperties(stream,this);
    pcVar6 = "    </testcase>\n";
  }
  std::operator<<(stream,pcVar6);
LAB_0011205d:
  std::__cxx11::string::~string((string *)&kTestsuite);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
    OutputXmlAttribute(stream, kTestsuite, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestsuite, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "result",
                     test_info.should_run()
                         ? (result.Skipped() ? "skipped" : "completed")
                         : "suppressed");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuite, "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary)
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}